

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::PointSizeCase::iterate(PointSizeCase *this)

{
  ostringstream *poVar1;
  uint uVar2;
  RenderContext *context;
  TestLog *pTVar3;
  bool bVar4;
  int i;
  int iVar5;
  int iVar6;
  deUint32 dVar7;
  ChannelOrder CVar8;
  ChannelOrder CVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  RenderTarget *pRVar10;
  TestError *this_00;
  ConstPixelBufferAccess *access;
  int iVar11;
  void *__buf;
  qpTestResult testResult;
  char *pcVar12;
  void *data;
  long lVar13;
  ulong uVar14;
  int iVar15;
  ChannelType CVar16;
  Surface resultImage;
  VertexArray vao;
  Surface local_240;
  int local_224;
  ConstPixelBufferAccess local_220;
  string local_1f8;
  TextureFormat local_1d8;
  string local_1d0;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [264];
  
  tcu::Surface::Surface(&local_240,0x20,0x20);
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar13 = CONCAT44(extraout_var,iVar5);
  uVar2 = this->m_flags;
  iVar5 = (**(code **)(lVar13 + 0x780))((this->m_program->m_program).m_program,"a_position");
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_VERTEX_ARRAY);
  glu::ObjectWrapper::ObjectWrapper
            ((ObjectWrapper *)&local_220,(Functions *)CONCAT44(extraout_var_00,iVar6),traits);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Rendering single point.",0x17);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  if (iVar5 == -1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    local_1b0._0_8_ = &local_1a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"Attribute a_position location was -1","");
    tcu::TestError::TestError(this_00,(string *)local_1b0);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar13 + 0x1a00))(0,0,0x20,0x20);
  (**(code **)(lVar13 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar13 + 0x188))(0x4000);
  dVar7 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar7,"clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x734);
  (**(code **)(lVar13 + 0xd8))(local_220.m_size.m_data[2]);
  dVar7 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar7,"bind vao",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x737);
  (**(code **)(lVar13 + 0x1680))((this->m_program->m_program).m_program);
  dVar7 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar7,"use program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x73a);
  (**(code **)(lVar13 + 0x1858))(0,0,0,0x3f800000,iVar5);
  if ((uVar2 & 0x1e) == 0) {
    (**(code **)(lVar13 + 0x538))(0,0,1);
    dVar7 = (**(code **)(lVar13 + 0x800))();
    iVar5 = 0x749;
    pcVar12 = "draw points";
  }
  else {
    (**(code **)(lVar13 + 0xfd8))(0x8e72,1);
    dVar7 = (**(code **)(lVar13 + 0x800))();
    glu::checkError(dVar7,"set patch param",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                    ,0x741);
    (**(code **)(lVar13 + 0x538))(0xe,0,1);
    dVar7 = (**(code **)(lVar13 + 0x800))();
    iVar5 = 0x744;
    pcVar12 = "draw patches";
  }
  glu::checkError(dVar7,pcVar12,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,iVar5);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_1f8._M_dataplus._M_p = (pointer)0x300000008;
  data = (void *)local_240.m_pixels.m_cap;
  if ((void *)local_240.m_pixels.m_cap != (void *)0x0) {
    data = local_240.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_1f8,local_240.m_width,
             local_240.m_height,1,data);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_1b0);
  glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)&local_220);
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  local_224 = pRVar10->m_numSamples;
  CVar8 = getExpectedPointSize(this);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Verifying rendered point size. Expecting ",0x29);
  std::ostream::operator<<(poVar1,CVar8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," pixels.",8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1f8.field_2._M_allocated_capacity._0_7_ = 0x497265646e6552;
  local_1f8.field_2._7_4_ = 0x6567616d;
  local_1f8._M_string_length = 0xb;
  local_1f8.field_2._M_local_buf[0xb] = '\0';
  local_1d0.field_2._M_allocated_capacity._0_6_ = 0x7265646e6552;
  local_1d0.field_2._M_allocated_capacity._6_2_ = 0x6465;
  local_1d0.field_2._8_6_ = 0x6567616d6920;
  local_1d0._M_string_length = 0xe;
  local_1d0.field_2._M_local_buf[0xe] = '\0';
  local_1d8.order = RGBA;
  local_1d8.type = UNORM_INT8;
  if ((void *)local_240.m_pixels.m_cap != (void *)0x0) {
    local_240.m_pixels.m_cap = (size_t)local_240.m_pixels.m_ptr;
  }
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_220,&local_1d8,local_240.m_width,local_240.m_height,1,
             (void *)local_240.m_pixels.m_cap);
  access = &local_220;
  tcu::LogImage::LogImage
            ((LogImage *)local_1b0,&local_1f8,&local_1d0,access,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_1b0,(int)pTVar3,__buf,(size_t)access);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != local_180) {
    operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != &local_1a0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,
                    CONCAT26(local_1d0.field_2._M_allocated_capacity._6_2_,
                             local_1d0.field_2._M_allocated_capacity._0_6_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,
                    CONCAT17(local_1f8.field_2._M_local_buf[7],
                             local_1f8.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if (local_240.m_height < 1) {
    local_1b0._4_4_ = SNORM_INT8;
    local_1b0._0_4_ = R;
    iVar5 = 0;
    iVar6 = 0;
    bVar4 = false;
  }
  else {
    lVar13 = 0;
    iVar15 = 0;
    bVar4 = false;
    iVar6 = 0;
    iVar5 = 0;
    local_1b0._0_4_ = R;
    local_1b0._4_4_ = SNORM_INT8;
    do {
      if (0 < local_240.m_width) {
        CVar16 = iVar15 + SNORM_INT16;
        uVar14 = 0;
        do {
          iVar11 = (int)uVar14;
          if ((*(uint *)((long)local_240.m_pixels.m_ptr + (long)((int)lVar13 + iVar11) * 4) &
              0xffffff) != 0) {
            if (bVar4) {
              if (iVar11 <= iVar6) {
                iVar6 = iVar11;
              }
              if (iVar15 <= iVar5) {
                iVar5 = iVar15;
              }
              if ((int)local_1b0._0_4_ <= (int)(iVar11 + A)) {
                local_1b0._0_4_ = iVar11 + A;
              }
              if ((int)local_1b0._4_4_ <= (int)CVar16) {
                local_1b0._4_4_ = CVar16;
              }
            }
            else {
              local_1b0._0_4_ = iVar11 + A;
              bVar4 = true;
              iVar6 = iVar11;
              iVar5 = iVar15;
              local_1b0._4_4_ = CVar16;
            }
          }
          uVar14 = uVar14 + 1;
        } while ((uint)local_240.m_width != uVar14);
      }
      iVar15 = iVar15 + 1;
      lVar13 = lVar13 + (ulong)(uint)local_240.m_width;
    } while (iVar15 != local_240.m_height);
  }
  if (bVar4) {
    if (local_224 < 2) {
      local_1f8._M_dataplus._M_p._4_4_ = iVar5;
      local_1f8._M_dataplus._M_p._0_4_ = iVar6;
      local_220.m_format.order = R;
      local_220.m_format.type = SNORM_INT8;
      lVar13 = 0;
      do {
        local_220.m_size.m_data[lVar13 + -2] =
             *(int *)(local_1b0 + lVar13 * 4) -
             *(int *)((long)&local_1f8._M_dataplus._M_p + lVar13 * 4);
        lVar13 = lVar13 + 1;
      } while (lVar13 == 1);
      if (local_220.m_format.order == local_220.m_format.type) {
        if (local_220.m_format.order == CVar8) goto LAB_015dbfa3;
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"ERROR! Point size invalid, expected ",0x24);
        std::ostream::operator<<(poVar1,CVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", got ",6);
        std::ostream::operator<<(poVar1,local_220.m_format.order);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"ERROR! Rasterized point is not a square. Point size was ",0x38
                  );
        tcu::operator<<((ostream *)poVar1,(Vector<int,_2> *)&local_220);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
    }
    else {
      local_1f8._M_dataplus._M_p._4_4_ = iVar5;
      local_1f8._M_dataplus._M_p._0_4_ = iVar6;
      local_220.m_format.order = R;
      local_220.m_format.type = SNORM_INT8;
      lVar13 = 0;
      do {
        local_220.m_size.m_data[lVar13 + -2] =
             *(int *)(local_1b0 + lVar13 * 4) -
             *(int *)((long)&local_1f8._M_dataplus._M_p + lVar13 * 4);
        lVar13 = lVar13 + 1;
      } while (lVar13 == 1);
      iVar11 = local_220.m_format.order - local_220.m_format.type;
      iVar15 = -iVar11;
      if (0 < iVar11) {
        iVar15 = iVar11;
      }
      if (iVar15 < 2) {
        CVar9 = local_220.m_format.type;
        if ((int)local_220.m_format.type < (int)local_220.m_format.order) {
          CVar9 = local_220.m_format.order;
        }
        if (CVar8 + A == CVar9 || CVar8 == CVar9) {
LAB_015dbfa3:
          local_1f8._M_dataplus._M_p._4_4_ = iVar5;
          local_1f8._M_dataplus._M_p._0_4_ = iVar6;
          pcVar12 = "Pass";
          testResult = QP_TEST_RESULT_PASS;
          goto LAB_015dbea3;
        }
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"ERROR! Point size invalid, expected ",0x24);
        std::ostream::operator<<(poVar1,CVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", got ",6);
        CVar8 = local_220.m_format.type;
        if ((int)local_220.m_format.type < (int)local_220.m_format.order) {
          CVar8 = local_220.m_format.order;
        }
        std::ostream::operator<<(poVar1,CVar8);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "ERROR! Rasterized point is not a square. Detected point size was ",0x41);
        tcu::operator<<((ostream *)poVar1,(Vector<int,_2> *)&local_220);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
    }
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),"Verification failed, could not find any point fragments."
               ,0x38);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base(local_138);
  pcVar12 = "Image verification failed";
  testResult = QP_TEST_RESULT_FAIL;
LAB_015dbea3:
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,pcVar12);
  tcu::Surface::~Surface(&local_240);
  return STOP;
}

Assistant:

PointSizeCase::IterateResult PointSizeCase::iterate (void)
{
	tcu::Surface resultImage(RENDER_SIZE, RENDER_SIZE);

	renderTo(resultImage);

	if (verifyImage(resultImage))
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");

	return STOP;
}